

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::ComputeOutputDir(cmGeneratorTarget *this,string *config,bool implib,string *out)

{
  cmLocalGenerator *pcVar1;
  cmMakefile *pcVar2;
  Snapshot snapshot;
  Snapshot snapshot_00;
  undefined8 uVar3;
  TargetType TVar4;
  char *pcVar5;
  ulong uVar6;
  cmCompiledGeneratorExpression *pcVar7;
  cmGlobalGenerator *pcVar8;
  bool bVar9;
  bool local_51a;
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [8];
  string suffix;
  undefined1 local_3b0 [7];
  bool iosPlatform;
  allocator local_389;
  string local_388;
  allocator local_361;
  string local_360;
  string local_340;
  undefined1 local_320 [24];
  auto_ptr<cmCompiledGeneratorExpression> cge_1;
  Snapshot local_2e0;
  cmListFileBacktrace local_2c8;
  undefined1 local_288 [8];
  cmGeneratorExpression ge_1;
  string local_240;
  char *local_220;
  char *outdir;
  undefined1 local_1f8 [24];
  auto_ptr<cmCompiledGeneratorExpression> cge;
  Snapshot local_1b8;
  cmListFileBacktrace local_1a0;
  undefined1 local_160 [8];
  cmGeneratorExpression ge;
  string local_118;
  char *local_f8;
  char *config_outdir;
  string configPropStr;
  char *configProp;
  string configUpper;
  string propertyNameStr;
  char *propertyName;
  string local_70 [8];
  string targetTypeName;
  string conf;
  bool usesDefaultOutputDir;
  string *out_local;
  bool implib_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  std::__cxx11::string::string((string *)(targetTypeName.field_2._M_local_buf + 8),(string *)config)
  ;
  pcVar5 = GetOutputTargetType(this,implib);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar5,(allocator *)((long)&propertyName + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&propertyName + 3));
  propertyNameStr.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(configUpper.field_2._M_local_buf + 8),local_70);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)(configUpper.field_2._M_local_buf + 8),"_OUTPUT_DIRECTORY");
    propertyNameStr.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  cmsys::SystemTools::UpperCase((string *)&configProp,(string *)((long)&targetTypeName.field_2 + 8))
  ;
  configPropStr.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)&config_outdir,local_70);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&config_outdir,"_OUTPUT_DIRECTORY_");
    std::__cxx11::string::operator+=((string *)&config_outdir,(string *)&configProp);
    configPropStr.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  uVar3 = configPropStr.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,(char *)uVar3,
             (allocator *)((long)&ge.Backtrace.Snapshot.Position.Position + 7));
  pcVar5 = GetProperty(this,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&ge.Backtrace.Snapshot.Position.Position + 7));
  local_f8 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_240,(char *)propertyNameStr.field_2._8_8_,
               (allocator *)((long)&ge_1.Backtrace.Snapshot.Position.Position + 7));
    pcVar5 = GetProperty(this,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&ge_1.Backtrace.Snapshot.Position.Position + 7));
    local_220 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      TVar4 = GetType(this);
      if (TVar4 == EXECUTABLE) {
        pcVar2 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_360,"EXECUTABLE_OUTPUT_PATH",&local_361);
        pcVar5 = cmMakefile::GetSafeDefinition(pcVar2,&local_360);
        std::__cxx11::string::operator=((string *)out,pcVar5);
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator((allocator<char> *)&local_361);
      }
      else {
        TVar4 = GetType(this);
        if (((TVar4 == STATIC_LIBRARY) || (TVar4 = GetType(this), TVar4 == SHARED_LIBRARY)) ||
           (TVar4 = GetType(this), TVar4 == MODULE_LIBRARY)) {
          pcVar2 = this->Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_388,"LIBRARY_OUTPUT_PATH",&local_389);
          pcVar5 = cmMakefile::GetSafeDefinition(pcVar2,&local_388);
          std::__cxx11::string::operator=((string *)out,pcVar5);
          std::__cxx11::string::~string((string *)&local_388);
          std::allocator<char>::~allocator((allocator<char> *)&local_389);
        }
      }
    }
    else {
      cmState::Snapshot::Snapshot(&local_2e0,(cmState *)0x0);
      cmCommandContext::cmCommandContext((cmCommandContext *)&cge_1);
      snapshot_00.Position.Tree = local_2e0.Position.Tree;
      snapshot_00.State = local_2e0.State;
      snapshot_00.Position.Position = local_2e0.Position.Position;
      cmListFileBacktrace::cmListFileBacktrace(&local_2c8,snapshot_00,(cmCommandContext *)&cge_1);
      cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_288,&local_2c8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_2c8);
      cmCommandContext::~cmCommandContext((cmCommandContext *)&cge_1);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_320,local_288);
      local_320._8_8_ = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_320);
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)(local_320 + 0x10),
                 (auto_ptr_ref<cmCompiledGeneratorExpression>)local_320._8_8_);
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_320);
      pcVar7 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                         ((auto_ptr<cmCompiledGeneratorExpression> *)(local_320 + 0x10));
      pcVar1 = this->LocalGenerator;
      std::__cxx11::string::string((string *)&local_340);
      pcVar5 = cmCompiledGeneratorExpression::Evaluate
                         (pcVar7,pcVar1,config,false,(cmGeneratorTarget *)0x0,
                          (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_340
                         );
      std::__cxx11::string::operator=((string *)out,pcVar5);
      std::__cxx11::string::~string((string *)&local_340);
      bVar9 = std::operator!=(out,local_220);
      if (bVar9) {
        std::__cxx11::string::operator=((string *)(targetTypeName.field_2._M_local_buf + 8),"");
      }
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)(local_320 + 0x10));
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_288);
    }
  }
  else {
    cmState::Snapshot::Snapshot(&local_1b8,(cmState *)0x0);
    cmCommandContext::cmCommandContext((cmCommandContext *)&cge);
    snapshot.Position.Tree = local_1b8.Position.Tree;
    snapshot.State = local_1b8.State;
    snapshot.Position.Position = local_1b8.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace(&local_1a0,snapshot,(cmCommandContext *)&cge);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_160,&local_1a0);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1a0);
    cmCommandContext::~cmCommandContext((cmCommandContext *)&cge);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_1f8,local_160);
    local_1f8._8_8_ = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_1f8);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_1f8 + 0x10),
               (auto_ptr_ref<cmCompiledGeneratorExpression>)local_1f8._8_8_);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_1f8);
    pcVar7 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                       ((auto_ptr<cmCompiledGeneratorExpression> *)(local_1f8 + 0x10));
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&outdir);
    pcVar5 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar7,pcVar1,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0
                        ,(cmGeneratorExpressionDAGChecker *)0x0,(string *)&outdir);
    std::__cxx11::string::operator=((string *)out,pcVar5);
    std::__cxx11::string::~string((string *)&outdir);
    std::__cxx11::string::operator=((string *)(targetTypeName.field_2._M_local_buf + 8),"");
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_1f8 + 0x10));
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_160);
  }
  uVar6 = std::__cxx11::string::empty();
  bVar9 = (uVar6 & 1) != 0;
  if (bVar9) {
    std::__cxx11::string::operator=((string *)out,".");
  }
  pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory(this->LocalGenerator);
  cmsys::SystemTools::CollapseFullPath((string *)local_3b0,out,pcVar5);
  std::__cxx11::string::operator=((string *)out,(string *)local_3b0);
  std::__cxx11::string::~string((string *)local_3b0);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    suffix.field_2._M_local_buf[0xf] = cmMakefile::PlatformIsAppleIos(this->Makefile);
    local_51a = false;
    if (bVar9) {
      local_51a = (bool)suffix.field_2._M_local_buf[0xf];
    }
    pcVar5 = "";
    if (local_51a != false) {
      pcVar5 = "${EFFECTIVE_PLATFORM_NAME}";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d8,pcVar5,&local_3d9);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
    pcVar8 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_400,"/",&local_401);
    (*pcVar8->_vptr_cmGlobalGenerator[0x10])
              (pcVar8,local_400,(undefined1 *)((long)&targetTypeName.field_2 + 8),local_3d8,out);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    std::__cxx11::string::~string(local_3d8);
  }
  std::__cxx11::string::~string((string *)&config_outdir);
  std::__cxx11::string::~string((string *)&configProp);
  std::__cxx11::string::~string((string *)(configUpper.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)(targetTypeName.field_2._M_local_buf + 8));
  return bVar9;
}

Assistant:

bool cmGeneratorTarget::ComputeOutputDir(const std::string& config,
                                bool implib, std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(implib);
  const char* propertyName = 0;
  std::string propertyNameStr = targetTypeName;
  if(!propertyNameStr.empty())
    {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
    }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = 0;
  std::string configPropStr = targetTypeName;
  if(!configPropStr.empty())
    {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
    }

  // Select an output directory.
  if(const char* config_outdir = this->GetProperty(configProp))
    {
    // Use the user-specified per-configuration output directory.
    cmGeneratorExpression ge;
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(config_outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory.
    conf = "";
    }
  else if(const char* outdir = this->GetProperty(propertyName))
    {
    // Use the user-specified output directory.
    cmGeneratorExpression ge;
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != outdir)
      {
      conf = "";
      }
    }
  else if(this->GetType() == cmState::EXECUTABLE)
    {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
    }
  else if(this->GetType() == cmState::STATIC_LIBRARY ||
          this->GetType() == cmState::SHARED_LIBRARY ||
          this->GetType() == cmState::MODULE_LIBRARY)
    {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
    }
  if(out.empty())
    {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
    }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath
         (out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if(!conf.empty())
    {
    bool iosPlatform = this->Makefile->PlatformIsAppleIos();
    std::string suffix =
      usesDefaultOutputDir && iosPlatform ? "${EFFECTIVE_PLATFORM_NAME}" : "";
    this->LocalGenerator->GetGlobalGenerator()->
      AppendDirectoryForConfig("/", conf, suffix, out);
    }

  return usesDefaultOutputDir;
}